

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O2

TLVWriter * __thiscall ASDCP::MXF::TLVWriter::WriteTag(TLVWriter *this,MDDEntry *Entry)

{
  long *plVar1;
  int iVar2;
  bool bVar3;
  ILogSink *pIVar4;
  long in_RDX;
  undefined1 *puVar5;
  TagValue TmpTag;
  ui8_t local_9a;
  ui8_t local_99;
  int local_98 [26];
  
  plVar1 = *(long **)Entry[2].ul;
  if (plVar1 == (long *)0x0) {
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar4,"No Primer object available.\n");
  }
  else {
    (**(code **)(*plVar1 + 0x18))((Result_t *)local_98,plVar1,in_RDX,&local_9a);
    iVar2 = Kumu::RESULT_OK;
    Kumu::Result_t::~Result_t((Result_t *)local_98);
    if (local_98[0] == iVar2) {
      bVar3 = Kumu::MemIOWriter::WriteUi8((MemIOWriter *)Entry,local_9a);
      if (!bVar3) {
        local_98[0] = 0x262;
LAB_00194415:
        Kumu::Result_t::operator()((int *)this,ASDCP::RESULT_KLV_CODING);
        return this;
      }
      bVar3 = Kumu::MemIOWriter::WriteUi8((MemIOWriter *)Entry,local_99);
      if (!bVar3) {
        local_98[0] = 0x263;
        goto LAB_00194415;
      }
      puVar5 = (undefined1 *)&Kumu::RESULT_OK;
      goto LAB_001943f3;
    }
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar4,"No tag for entry %s\n",*(undefined8 *)(in_RDX + 0x18));
  }
  puVar5 = Kumu::RESULT_FAIL;
LAB_001943f3:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar5);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVWriter::WriteTag(const MDDEntry& Entry)
{
  if ( m_Lookup == 0 )
    {
      DefaultLogSink().Error("No Primer object available.\n");
      return RESULT_FAIL;
    }

  TagValue TmpTag;

  if ( m_Lookup->InsertTag(Entry, TmpTag) != RESULT_OK )
    {
      DefaultLogSink().Error("No tag for entry %s\n", Entry.name);
      return RESULT_FAIL;
    }

  if ( ! MemIOWriter::WriteUi8(TmpTag.a) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
  if ( ! MemIOWriter::WriteUi8(TmpTag.b) ) return RESULT_KLV_CODING(__LINE__, __FILE__);
  return RESULT_OK;
}